

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiTable::~ImGuiTable(ImGuiTable *this)

{
  ImGui::MemFree(this->RawData);
  ImVector<ImGuiTableColumnSortSpecs>::~ImVector(&this->SortSpecsMulti);
  ImVector<char>::~ImVector(&(this->ColumnsNames).Buf);
  return;
}

Assistant:

~ImGuiTable()               { IM_FREE(RawData); }